

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleStringTest.cpp
# Opt level: O2

void __thiscall
TEST_SimpleString_Binary_Test::~TEST_SimpleString_Binary_Test(TEST_SimpleString_Binary_Test *this)

{
  TEST_GROUP_CppUTestGroupSimpleString::~TEST_GROUP_CppUTestGroupSimpleString
            (&this->super_TEST_GROUP_CppUTestGroupSimpleString);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(SimpleString, Binary)
{
    const unsigned char value[] = { 0x00, 0x01, 0x2A, 0xFF };
    const char expectedString[] = "00 01 2A FF";

    STRCMP_EQUAL(expectedString, StringFromBinary(value, sizeof(value)).asCharString());
    STRCMP_EQUAL(expectedString, StringFromBinaryOrNull(value, sizeof(value)).asCharString());
    STRCMP_EQUAL("", StringFromBinary(value, 0).asCharString());
    STRCMP_EQUAL("(null)", StringFromBinaryOrNull(NULLPTR, 0).asCharString());
}